

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPTi>::~IntegratorBuilder(IntegratorBuilder<OpenMD::NPTi> *this)

{
  void *in_RDI;
  
  ~IntegratorBuilder((IntegratorBuilder<OpenMD::NPTi> *)0x1f1418);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

IntegratorBuilder(const std::string& ident) : IntegratorCreator(ident) {}